

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O0

void __thiscall
QTransposeProxyModelPrivate::onLayoutAboutToBeChanged
          (QTransposeProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  undefined1 uVar1;
  bool bVar2;
  QList<QModelIndex> *pQVar3;
  QModelIndex *pQVar4;
  int in_EDX;
  QList<QPersistentModelIndex> *in_RSI;
  QTransposeProxyModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *proxyPersistentIndex;
  QModelIndexList *__range1_1;
  LayoutChangeHint proxyHint;
  QPersistentModelIndex *parent;
  QList<QPersistentModelIndex> *__range1;
  QTransposeProxyModel *q;
  QPersistentModelIndex srcPersistentIndex;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QModelIndexList proxyPersistentIndexes;
  QModelIndex mappedParent;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QPersistentModelIndex> proxyParents;
  QModelIndex *in_stack_fffffffffffffe68;
  QList<QModelIndex> *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  QList<QModelIndex> *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffed8;
  uint uVar5;
  qsizetype in_stack_fffffffffffffef8;
  undefined1 local_e0 [24];
  undefined1 *local_c8;
  QModelIndex *local_c0;
  const_iterator local_b8;
  const_iterator local_b0;
  QList<QModelIndex> local_a8;
  undefined1 local_80 [24];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPersistentModelIndex local_48;
  QPersistentModelIndex *local_40;
  const_iterator local_38;
  const_iterator local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QList<QModelIndex> *)q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x8b1540);
  QList<QPersistentModelIndex>::size(in_RSI);
  QList<QPersistentModelIndex>::reserve
            ((QList<QPersistentModelIndex> *)in_RDI,in_stack_fffffffffffffef8);
  local_30.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QPersistentModelIndex>::begin
                       ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffe70);
  local_38.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = QList<QPersistentModelIndex>::end
                       ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffe70);
  while( true ) {
    local_40 = local_38.i;
    uVar1 = QList<QPersistentModelIndex>::const_iterator::operator!=(&local_30,local_38);
    if (!(bool)uVar1) break;
    QList<QPersistentModelIndex>::const_iterator::operator*(&local_30);
    bVar2 = QPersistentModelIndex::isValid((QPersistentModelIndex *)in_stack_fffffffffffffe70);
    if (bVar2) {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_fffffffffffffe98 = pQVar3;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QPersistentModelIndex *)
                 CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      (*(((QAbstractItemModel *)&(in_stack_fffffffffffffe98->d).d)->super_QObject)._vptr_QObject
        [0x33])(&local_68,in_stack_fffffffffffffe98,local_80);
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      QList<QPersistentModelIndex>::operator<<
                ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffe70,
                 (rvalue_ref)in_stack_fffffffffffffe68);
      QPersistentModelIndex::~QPersistentModelIndex
                ((QPersistentModelIndex *)in_stack_fffffffffffffe70);
    }
    else {
      QPersistentModelIndex::QPersistentModelIndex(&local_48);
      QList<QPersistentModelIndex>::operator<<
                ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffe70,
                 (rvalue_ref)in_stack_fffffffffffffe68);
      QPersistentModelIndex::~QPersistentModelIndex
                ((QPersistentModelIndex *)in_stack_fffffffffffffe70);
    }
    QList<QPersistentModelIndex>::const_iterator::operator++(&local_30);
  }
  if (in_EDX == 1) {
    uVar5 = 2;
  }
  else {
    uVar5 = (uint)(in_EDX == 2);
  }
  QAbstractItemModel::layoutAboutToBeChanged
            ((QAbstractItemModel *)in_stack_fffffffffffffe70,
             (QList<QPersistentModelIndex> *)in_stack_fffffffffffffe68,
             (LayoutChangeHint)((ulong)in_stack_fffffffffffffe78 >> 0x20));
  local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemModel::persistentIndexList
            ((QAbstractItemModel *)CONCAT17(uVar1,in_stack_fffffffffffffeb0));
  QList<QModelIndex>::clear(in_stack_fffffffffffffe70);
  QList<QPersistentModelIndex>::clear((QList<QPersistentModelIndex> *)in_stack_fffffffffffffe70);
  QList<QModelIndex>::size(&local_a8);
  QList<QModelIndex>::reserve(in_stack_fffffffffffffe98,CONCAT44(uVar5,in_stack_fffffffffffffed8));
  QList<QModelIndex>::size(&local_a8);
  QList<QPersistentModelIndex>::reserve
            ((QList<QPersistentModelIndex> *)in_RDI,in_stack_fffffffffffffef8);
  local_b0.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_b0 = QList<QModelIndex>::begin(in_stack_fffffffffffffe70);
  local_b8.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8 = QList<QModelIndex>::end(in_stack_fffffffffffffe70);
  while( true ) {
    local_c0 = local_b8.i;
    bVar2 = QList<QModelIndex>::const_iterator::operator!=(&local_b0,local_b8);
    if (!bVar2) break;
    pQVar4 = QList<QModelIndex>::const_iterator::operator*(&local_b0);
    QList<QModelIndex>::operator<<(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    (*(((QAbstractItemModel *)&(pQVar3->d).d)->super_QObject)._vptr_QObject[0x32])
              (local_e0,pQVar3,pQVar4);
    QPersistentModelIndex::QPersistentModelIndex
              ((QPersistentModelIndex *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    QList<QPersistentModelIndex>::operator<<
              ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffe70,
               (parameter_type)in_stack_fffffffffffffe68);
    QPersistentModelIndex::~QPersistentModelIndex
              ((QPersistentModelIndex *)in_stack_fffffffffffffe70);
    QList<QModelIndex>::const_iterator::operator++(&local_b0);
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8b1a58);
  QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x8b1a65);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTransposeProxyModelPrivate::onLayoutAboutToBeChanged(const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QTransposeProxyModel);
    QList<QPersistentModelIndex> proxyParents;
    proxyParents.reserve(sourceParents.size());
    for (const QPersistentModelIndex &parent : sourceParents) {
        if (!parent.isValid()) {
            proxyParents << QPersistentModelIndex();
            continue;
        }
        const QModelIndex mappedParent = q->mapFromSource(parent);
        Q_ASSERT(mappedParent.isValid());
        proxyParents << mappedParent;
    }
    QAbstractItemModel::LayoutChangeHint proxyHint = QAbstractItemModel::NoLayoutChangeHint;
    if (hint == QAbstractItemModel::VerticalSortHint)
        proxyHint = QAbstractItemModel::HorizontalSortHint;
    else if (hint == QAbstractItemModel::HorizontalSortHint)
        proxyHint = QAbstractItemModel::VerticalSortHint;
    emit q->layoutAboutToBeChanged(proxyParents, proxyHint);
    const QModelIndexList proxyPersistentIndexes = q->persistentIndexList();
    layoutChangeProxyIndexes.clear();
    layoutChangePersistentIndexes.clear();
    layoutChangeProxyIndexes.reserve(proxyPersistentIndexes.size());
    layoutChangePersistentIndexes.reserve(proxyPersistentIndexes.size());
    for (const QModelIndex &proxyPersistentIndex : proxyPersistentIndexes) {
        layoutChangeProxyIndexes << proxyPersistentIndex;
        Q_ASSERT(proxyPersistentIndex.isValid());
        const QPersistentModelIndex srcPersistentIndex = q->mapToSource(proxyPersistentIndex);
        Q_ASSERT(srcPersistentIndex.isValid());
        layoutChangePersistentIndexes << srcPersistentIndex;
    }
}